

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O3

bool llvm::cl::ExpandResponseFiles
               (StringSaver *Saver,TokenizerCallback Tokenizer,SmallVectorImpl<const_char_*> *Argv,
               bool MarkEOLs,bool RelativeNames)

{
  char *pcVar1;
  bool bVar2;
  uint uVar3;
  size_t sVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  StringRef FName;
  SmallVector<const_char_*,_0U> ExpandedArgv;
  SmallVectorImpl<const_char_*> local_58;
  uint local_48;
  uint local_44;
  StringSaver *local_40;
  TokenizerCallback local_38;
  
  uVar3 = (Argv->super_SmallVectorTemplateBase<const_char_*,_true>).
          super_SmallVectorTemplateCommon<const_char_*,_void>.super_SmallVectorBase.Size;
  if (uVar3 == 0) {
    bVar5 = true;
  }
  else {
    bVar5 = true;
    uVar8 = 0;
    local_44 = (uint)RelativeNames;
    local_48 = (uint)MarkEOLs;
    uVar9 = 0;
    uVar7 = 0;
    local_40 = Saver;
    local_38 = Tokenizer;
    do {
      if (uVar3 <= uVar9) {
        __assert_fail("idx < size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                      ,0x9b,
                      "reference llvm::SmallVectorTemplateCommon<const char *>::operator[](size_type) [T = const char *]"
                     );
      }
      pcVar1 = *(char **)((long)(Argv->super_SmallVectorTemplateBase<const_char_*,_true>).
                                super_SmallVectorTemplateCommon<const_char_*,_void>.
                                super_SmallVectorBase.BeginX + uVar8 * 8);
      if ((pcVar1 == (char *)0x0) || (*pcVar1 != '@')) {
        uVar9 = uVar9 + 1;
      }
      else {
        if (0x14 < uVar7) {
          return false;
        }
        local_58.super_SmallVectorTemplateBase<const_char_*,_true>.
        super_SmallVectorTemplateCommon<const_char_*,_void>.super_SmallVectorBase.BeginX = &local_48
        ;
        local_58.super_SmallVectorTemplateBase<const_char_*,_true>.
        super_SmallVectorTemplateCommon<const_char_*,_void>.super_SmallVectorBase.Size = 0;
        local_58.super_SmallVectorTemplateBase<const_char_*,_true>.
        super_SmallVectorTemplateCommon<const_char_*,_void>.super_SmallVectorBase.Capacity = 0;
        sVar4 = strlen(pcVar1 + 1);
        FName.Length = sVar4;
        FName.Data = pcVar1 + 1;
        bVar2 = ExpandResponseFile(FName,local_40,local_38,&local_58,SUB41(local_48,0),
                                   SUB41(local_44,0));
        if (bVar2) {
          SmallVectorImpl<const_char_*>::erase
                    (Argv,(const_iterator)
                          ((long)(Argv->super_SmallVectorTemplateBase<const_char_*,_true>).
                                 super_SmallVectorTemplateCommon<const_char_*,_void>.
                                 super_SmallVectorBase.BeginX + uVar8 * 8));
          SmallVectorImpl<char_const*>::insert<char_const**,void>
                    ((SmallVectorImpl<char_const*> *)Argv,
                     (iterator)
                     (uVar8 * 8 +
                     (long)(Argv->super_SmallVectorTemplateBase<const_char_*,_true>).
                           super_SmallVectorTemplateCommon<const_char_*,_void>.super_SmallVectorBase
                           .BeginX),
                     (char **)local_58.super_SmallVectorTemplateBase<const_char_*,_true>.
                              super_SmallVectorTemplateCommon<const_char_*,_void>.
                              super_SmallVectorBase.BeginX,
                     (char **)((long)local_58.super_SmallVectorTemplateBase<const_char_*,_true>.
                                     super_SmallVectorTemplateCommon<const_char_*,_void>.
                                     super_SmallVectorBase.BeginX +
                              (local_58.super_SmallVectorTemplateBase<const_char_*,_true>.
                               super_SmallVectorTemplateCommon<const_char_*,_void>.
                               super_SmallVectorBase._8_8_ & 0xffffffff) * 8));
          iVar6 = 0;
        }
        else {
          uVar9 = uVar9 + 1;
          iVar6 = 3;
          bVar5 = false;
        }
        if ((uint *)local_58.super_SmallVectorTemplateBase<const_char_*,_true>.
                    super_SmallVectorTemplateCommon<const_char_*,_void>.super_SmallVectorBase.BeginX
            != &local_48) {
          free(local_58.super_SmallVectorTemplateBase<const_char_*,_true>.
               super_SmallVectorTemplateCommon<const_char_*,_void>.super_SmallVectorBase.BeginX);
        }
        uVar7 = uVar7 + 1;
        if ((iVar6 != 3) && (iVar6 != 0)) {
          return false;
        }
      }
      uVar8 = (ulong)uVar9;
      uVar3 = (Argv->super_SmallVectorTemplateBase<const_char_*,_true>).
              super_SmallVectorTemplateCommon<const_char_*,_void>.super_SmallVectorBase.Size;
    } while (uVar3 != uVar9);
  }
  return bVar5;
}

Assistant:

bool cl::ExpandResponseFiles(StringSaver &Saver, TokenizerCallback Tokenizer,
                             SmallVectorImpl<const char *> &Argv,
                             bool MarkEOLs, bool RelativeNames) {
  unsigned RspFiles = 0;
  bool AllExpanded = true;

  // Don't cache Argv.size() because it can change.
  for (unsigned I = 0; I != Argv.size();) {
    const char *Arg = Argv[I];
    // Check if it is an EOL marker
    if (Arg == nullptr) {
      ++I;
      continue;
    }
    if (Arg[0] != '@') {
      ++I;
      continue;
    }

    // If we have too many response files, leave some unexpanded.  This avoids
    // crashing on self-referential response files.
    if (RspFiles++ > 20)
      return false;

    // Replace this response file argument with the tokenization of its
    // contents.  Nested response files are expanded in subsequent iterations.
    SmallVector<const char *, 0> ExpandedArgv;
    if (!ExpandResponseFile(Arg + 1, Saver, Tokenizer, ExpandedArgv,
                            MarkEOLs, RelativeNames)) {
      // We couldn't read this file, so we leave it in the argument stream and
      // move on.
      AllExpanded = false;
      ++I;
      continue;
    }
    Argv.erase(Argv.begin() + I);
    Argv.insert(Argv.begin() + I, ExpandedArgv.begin(), ExpandedArgv.end());
  }
  return AllExpanded;
}